

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmio.c
# Opt level: O0

int mm_write_banner(FILE *f,char *matcode)

{
  int iVar1;
  char *__ptr;
  int ret_code;
  char *str;
  char *matcode_local;
  FILE *f_local;
  
  __ptr = mm_typecode_to_str(matcode);
  iVar1 = fprintf((FILE *)f,"%s %s\n","%%MatrixMarket",__ptr);
  free(__ptr);
  if (iVar1 == 2) {
    f_local._4_4_ = 0;
  }
  else {
    f_local._4_4_ = 0x11;
  }
  return f_local._4_4_;
}

Assistant:

int mm_write_banner(FILE *f, MM_typecode matcode) {
    char *str = mm_typecode_to_str(matcode);
    int ret_code;

    ret_code = fprintf(f, "%s %s\n", MatrixMarketBanner, str);
    free(str);
    if (ret_code != 2)
        return MM_COULD_NOT_WRITE_FILE;
    else
        return 0;
}